

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O0

void PrintOutput(sunrealtype tfinal,N_Vector yB,N_Vector ypB)

{
  long *in_RDI;
  
  printf("dG/dy0: \t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n",
         **(undefined8 **)(*in_RDI + 0x10),*(undefined8 *)(*(long *)(*in_RDI + 0x10) + 8),
         *(undefined8 *)(*(long *)(*in_RDI + 0x10) + 0x10),
         *(undefined8 *)(*(long *)(*in_RDI + 0x10) + 0x18),
         *(undefined8 *)(*(long *)(*in_RDI + 0x10) + 0x20));
  printf("--------------------------------------------------------\n\n");
  return;
}

Assistant:

static void PrintOutput(sunrealtype tfinal, N_Vector yB, N_Vector ypB)
{
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("dG/dy0: "
         "\t%12.4Le\n\t\t%12.4Le\n\t\t%12.4Le\n\t\t%12.4Le\n\t\t%12.4Le\n",
#else
  printf("dG/dy0: \t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n",
#endif
         Ith(yB, 1), Ith(yB, 2), Ith(yB, 3), Ith(yB, 4), Ith(yB, 5));
  printf("--------------------------------------------------------\n\n");
}